

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_builder.cc
# Opt level: O0

void __thiscall leveldb::TableBuilder::Add(TableBuilder *this,Slice *key,Slice *value)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  char *__s;
  size_t sVar4;
  BlockBuilder *in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  size_t estimated_block_size;
  Rep *r;
  string handle_encoding;
  BlockBuilder *in_stack_ffffffffffffff28;
  string *in_stack_ffffffffffffff30;
  Slice *in_stack_ffffffffffffff38;
  BlockBuilder *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  FilterBlockBuilder *in_stack_ffffffffffffff50;
  Slice *in_stack_ffffffffffffff80;
  Slice *key_00;
  undefined1 local_38 [16];
  undefined8 local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  key_00 = (Slice *)*in_RDI;
  if (((*(byte *)&key_00[0x1d].data_ ^ 0xff) & 1) == 0) {
    __assert_fail("!r->closed",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/table/table_builder.cc"
                  ,0x60,"void leveldb::TableBuilder::Add(const Slice &, const Slice &)");
  }
  bVar2 = ok((TableBuilder *)in_stack_ffffffffffffff40);
  if (bVar2) {
    if (0 < (long)key_00[0x1c].size_) {
      plVar1 = (long *)key_00->data_;
      Slice::Slice(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      iVar3 = (**(code **)(*plVar1 + 0x10))(plVar1,in_RSI,local_38);
      if (iVar3 < 1) {
        __assert_fail("r->options.comparator->Compare(key, Slice(r->last_key)) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/table/table_builder.cc"
                      ,99,"void leveldb::TableBuilder::Add(const Slice &, const Slice &)");
      }
    }
    if (((ulong)key_00[0x1e].data_ & 1) != 0) {
      bVar2 = BlockBuilder::empty(in_stack_ffffffffffffff28);
      if (!bVar2) {
        __assert_fail("r->data_block.empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/table/table_builder.cc"
                      ,0x67,"void leveldb::TableBuilder::Add(const Slice &, const Slice &)");
      }
      (**(code **)(*(long *)key_00->data_ + 0x20))(key_00->data_,&key_00[0x1a].size_,in_RSI);
      in_stack_ffffffffffffff50 = (FilterBlockBuilder *)&stack0xffffffffffffffd8;
      std::__cxx11::string::string(in_stack_ffffffffffffff40);
      BlockHandle::EncodeTo((BlockHandle *)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      in_stack_ffffffffffffff48 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(key_00 + 0x14);
      Slice::Slice(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      Slice::Slice(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      BlockBuilder::Add(in_RDX,key_00,in_stack_ffffffffffffff80);
      *(undefined1 *)&key_00[0x1e].data_ = 0;
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff28);
    }
    if (key_00[0x1d].size_ != 0) {
      FilterBlockBuilder::AddKey(in_stack_ffffffffffffff50,(Slice *)in_stack_ffffffffffffff48);
    }
    this_00 = (BlockBuilder *)&key_00[0x1a].size_;
    __s = Slice::data((Slice *)in_stack_ffffffffffffff28);
    Slice::size((Slice *)in_stack_ffffffffffffff28);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (in_stack_ffffffffffffff48,__s,(size_type)this_00);
    key_00[0x1c].size_ = key_00[0x1c].size_ + 1;
    BlockBuilder::Add(in_RDX,key_00,in_stack_ffffffffffffff80);
    sVar4 = BlockBuilder::CurrentSizeEstimate(this_00);
    if (key_00[3].size_ <= sVar4) {
      Flush((TableBuilder *)in_stack_ffffffffffffff30);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void TableBuilder::Add(const Slice& key, const Slice& value) {
  Rep* r = rep_;
  assert(!r->closed);
  if (!ok()) return;
  if (r->num_entries > 0) {
    assert(r->options.comparator->Compare(key, Slice(r->last_key)) > 0);
  }

  if (r->pending_index_entry) {
    assert(r->data_block.empty());
    r->options.comparator->FindShortestSeparator(&r->last_key, key);
    std::string handle_encoding;
    r->pending_handle.EncodeTo(&handle_encoding);
    r->index_block.Add(r->last_key, Slice(handle_encoding));
    r->pending_index_entry = false;
  }

  if (r->filter_block != nullptr) {
    r->filter_block->AddKey(key);
  }

  r->last_key.assign(key.data(), key.size());
  r->num_entries++;
  r->data_block.Add(key, value);

  const size_t estimated_block_size = r->data_block.CurrentSizeEstimate();
  if (estimated_block_size >= r->options.block_size) {
    Flush();
  }
}